

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CsvConsumer(char *zToken,int nTokenLen,void *pUserData)

{
  ushort **ppuVar1;
  bool bVar2;
  undefined1 local_80 [8];
  SyString sToken;
  jx9_value sEntry;
  jx9_value *pArray;
  void *pUserData_local;
  int nTokenLen_local;
  char *zToken_local;
  
  local_80 = (undefined1  [8])zToken;
  sToken.zString._0_4_ = nTokenLen;
  while( true ) {
    bVar2 = false;
    if ((((int)sToken.zString != 0) && (bVar2 = false, *(byte *)local_80 < 0xc0)) &&
       (bVar2 = true, *(byte *)local_80 != 0)) {
      ppuVar1 = __ctype_b_loc();
      bVar2 = ((*ppuVar1)[(int)(char)*(byte *)local_80] & 0x2000) != 0;
    }
    if (!bVar2) break;
    sToken.zString._0_4_ = (int)sToken.zString + -1;
    local_80 = (undefined1  [8])((long)local_80 + 1);
  }
  while( true ) {
    bVar2 = false;
    if ((((int)sToken.zString != 0) &&
        (bVar2 = false, *(byte *)((long)local_80 + (ulong)((int)sToken.zString - 1)) < 0xc0)) &&
       (bVar2 = true, *(byte *)((long)local_80 + (ulong)((int)sToken.zString - 1)) != 0)) {
      ppuVar1 = __ctype_b_loc();
      bVar2 = ((*ppuVar1)[(int)(char)*(byte *)((long)local_80 + (ulong)((int)sToken.zString - 1))] &
              0x2000) != 0;
    }
    if (!bVar2) break;
    sToken.zString._0_4_ = (int)sToken.zString + -1;
  }
  if ((int)sToken.zString != 0) {
    jx9MemObjInitFromString
              (*(jx9_vm **)((long)pUserData + 0x10),(jx9_value *)&sToken.nByte,(SyString *)local_80)
    ;
    jx9_array_add_elem((jx9_value *)pUserData,(jx9_value *)0x0,(jx9_value *)&sToken.nByte);
    jx9MemObjRelease((jx9_value *)&sToken.nByte);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CsvConsumer(const char *zToken, int nTokenLen, void *pUserData)
{
	jx9_value *pArray = (jx9_value *)pUserData;
	jx9_value sEntry;
	SyString sToken;
	/* Insert the token in the given array */
	SyStringInitFromBuf(&sToken, zToken, nTokenLen);
	/* Remove trailing and leading white spcaces and null bytes */
	SyStringFullTrimSafe(&sToken);
	if( sToken.nByte < 1){
		return SXRET_OK;
	}
	jx9MemObjInitFromString(pArray->pVm, &sEntry, &sToken);
	jx9_array_add_elem(pArray, 0, &sEntry);
	jx9MemObjRelease(&sEntry);
	return SXRET_OK;
}